

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

int my_memcasecmp(char *a,char *b,size_t len)

{
  byte bVar1;
  byte bVar2;
  uchar ub;
  size_t sStack_28;
  uchar ua;
  size_t len_local;
  char *b_local;
  char *a_local;
  
  sStack_28 = len;
  len_local = (size_t)b;
  b_local = a;
  while( true ) {
    if (sStack_28 == 0) {
      return 0;
    }
    bVar1 = my_tolower(*b_local);
    bVar2 = my_tolower(*(char *)len_local);
    if (bVar1 != bVar2) break;
    b_local = b_local + 1;
    len_local = len_local + 1;
    sStack_28 = sStack_28 - 1;
  }
  return (uint)bVar1 - (uint)bVar2;
}

Assistant:

static inline int my_memcasecmp(const char* a, const char* b, size_t len) {
	while (len != 0) {
		unsigned char ua = my_tolower(*a);
		unsigned char ub = my_tolower(*b);

		if (ua != ub)
			return ua - ub;

		a++;
		b++;
		len--;
	}

	return 0;
}